

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

logic_t __thiscall slang::SVInt::operator<(SVInt *this,SVInt *rhs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  logic_t lVar5;
  bitwidth_t bVar6;
  bitwidth_t bVar7;
  bool bVar8;
  uint uVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  byte local_2b;
  
  lVar5.value = 0x80;
  if (((this->super_SVIntStorage).unknownFlag == false) &&
     ((rhs->super_SVIntStorage).unknownFlag == false)) {
    bVar4 = (rhs->super_SVIntStorage).signFlag & (this->super_SVIntStorage).signFlag;
    uVar9 = (this->super_SVIntStorage).bitWidth;
    uVar1 = (rhs->super_SVIntStorage).bitWidth;
    if (uVar9 == uVar1) {
      if (bVar4 != 0) {
        lVar5 = operator[](this,uVar9 - 1);
        bVar8 = (lVar5.value & 0x7f) != 0 && lVar5.value != '@';
        lVar5 = operator[](rhs,uVar9 - 1);
        if (bVar8 != ((lVar5.value & 0x7f) != 0 && lVar5.value != '@')) {
          return (logic_t)bVar8;
        }
      }
      if (uVar9 < 0x41) {
        lVar5.value = (this->super_SVIntStorage).field_0.val < (rhs->super_SVIntStorage).field_0.val
        ;
      }
      else {
        bVar6 = getActiveBits(this);
        bVar7 = getActiveBits(rhs);
        if (bVar6 < bVar7) {
LAB_001c2e09:
          lVar5.value = '\x01';
        }
        else if (bVar6 - 1 < bVar7) {
          lVar5.value = '\0';
          uVar9 = bVar6 - 1 >> 6;
          do {
            uVar2 = (rhs->super_SVIntStorage).field_0.pVal[uVar9];
            uVar3 = (this->super_SVIntStorage).field_0.pVal[uVar9];
            if (uVar3 >= uVar2 && uVar3 != uVar2) goto LAB_001c2e92;
            if (uVar3 < uVar2) goto LAB_001c2e09;
            bVar8 = 0 < (int)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar8);
        }
        else {
LAB_001c2e92:
          lVar5.value = '\0';
        }
      }
    }
    else {
      if (uVar9 < uVar1) {
        if (bVar4 == 0) {
          zext((SVInt *)&local_38,(bitwidth_t)this);
        }
        else {
          sext((SVInt *)&local_38,(bitwidth_t)this);
        }
        lVar5 = operator<((SVInt *)&local_38,rhs);
      }
      else {
        if (bVar4 == 0) {
          zext((SVInt *)&local_38,(bitwidth_t)rhs);
        }
        else {
          sext((SVInt *)&local_38,(bitwidth_t)rhs);
        }
        lVar5 = operator<(this,(SVInt *)&local_38);
      }
      if (((0x40 < local_30) || ((local_2b & 1) != 0)) && ((void *)local_38.val != (void *)0x0)) {
        operator_delete__(local_38.pVal);
      }
    }
  }
  return (logic_t)lVar5.value;
}

Assistant:

logic_t SVInt::operator<(const SVInt& rhs) const {
    if (unknownFlag || rhs.hasUnknown())
        return logic_t::x;

    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) < rhs;
        else
            return *this < rhs.extend(bitWidth, bothSigned);
    }
    // handle signed negatives
    if (bothSigned && isNegative() ^ rhs.isNegative())
        return logic_t(isNegative());

    // both are positive or both are negative
    // or not both are signed
    if (isSingleWord())
        return logic_t(val < rhs.val);

    bitwidth_t a1 = getActiveBits();
    bitwidth_t a2 = rhs.getActiveBits();
    if (a1 < a2)
        return logic_t(true);
    if (a2 < a1)
        return logic_t(false);
    if (a1 == 0)
        return logic_t(false); // both values are zero

    // same number of words, compare each one until there's no match
    uint32_t top = whichWord(a1 - 1);
    for (int i = int(top); i >= 0; i--) {
        if (pVal[i] > rhs.pVal[i])
            return logic_t(false);
        if (pVal[i] < rhs.pVal[i])
            return logic_t(true);
    }
    return logic_t(false);
}